

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_derived_from_or_self
              (lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  lyd_node *plVar1;
  lys_node *plVar2;
  char *ident_str;
  lys_ident **pplVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  lyxp_set *plVar8;
  ushort uVar9;
  undefined *puVar10;
  ulong uVar11;
  ushort uVar12;
  ulong uVar13;
  
  if ((*args)->type < LYXP_SET_SNODE_SET) {
    iVar5 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    iVar6 = -1;
    if (iVar5 == 0) {
      if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
        free((set->val).nodes);
      }
      set->type = LYXP_SET_BOOLEAN;
      (set->val).bool = 0;
      plVar8 = *args;
      iVar6 = 0;
      if ((plVar8->type != LYXP_SET_EMPTY) && (plVar8->used != 0)) {
        uVar9 = 0;
        do {
          plVar1 = (plVar8->val).nodes[uVar9].node;
          plVar2 = plVar1->schema;
          if (((plVar2->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
             (iVar6._0_2_ = plVar2[1].flags, iVar6._2_1_ = plVar2[1].ext_size,
             iVar6._3_1_ = plVar2[1].iffeature_size, iVar6 == 7)) {
            plVar2 = plVar1[1].schema;
            ident_str = (args[1]->val).str;
            iVar6 = xpath_derived_from_ident_cmp((lys_ident *)plVar2,ident_str);
            if (iVar6 == 0) {
              set->type = LYXP_SET_BOOLEAN;
              (set->val).bool = 1;
              break;
            }
            bVar4 = plVar2->padding[3];
            uVar13 = (ulong)bVar4;
            if (uVar13 == 0) {
              bVar4 = 0;
              uVar12 = 0;
            }
            else {
              pplVar3 = *(lys_ident ***)&plVar2->nodetype;
              uVar11 = 0;
              do {
                iVar6 = xpath_derived_from_ident_cmp(pplVar3[uVar11],ident_str);
                if (iVar6 == 0) {
                  set->type = LYXP_SET_BOOLEAN;
                  (set->val).bool = 1;
                  bVar4 = (plVar1[1].schema)->padding[3];
                  uVar13 = uVar11 & 0xffffffff;
                  break;
                }
                uVar11 = uVar11 + 1;
              } while (uVar13 != uVar11);
              uVar12 = (ushort)uVar13;
            }
            if (uVar12 < bVar4) {
              return 0;
            }
            plVar8 = *args;
          }
          uVar9 = uVar9 + 1;
        } while ((uint)uVar9 < plVar8->used);
        iVar6 = 0;
      }
    }
  }
  else {
    uVar7 = (*args)->type - LYXP_SET_SNODE_SET;
    if (uVar7 < 4) {
      puVar10 = (&PTR_anon_var_dwarf_61d77_001add30)[uVar7];
    }
    else {
      puVar10 = (undefined *)0x0;
    }
    ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,puVar10,
            "derived-from-or-self(node-set, string)");
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int
xpath_derived_from_or_self(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node,
                           struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    uint16_t i, j;
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "derived-from-or-self(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type != LYXP_SET_EMPTY) {
        for (i = 0; i < args[0]->used; ++i) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[i].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_IDENT)) {
                if (!xpath_derived_from_ident_cmp(leaf->value.ident, args[1]->val.str)) {
                    set_fill_boolean(set, 1);
                    break;
                }

                for (j = 0; j < leaf->value.ident->base_size; ++j) {
                    if (!xpath_derived_from_ident_cmp(leaf->value.ident->base[j], args[1]->val.str)) {
                        set_fill_boolean(set, 1);
                        break;
                    }
                }

                if (j < leaf->value.ident->base_size) {
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}